

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_EndpointType.cpp
# Opt level: O3

char * soul::getInterpolationDescription(InterpolationType type)

{
  if (type < (fast|linear)) {
    return &DAT_0027bb3c + *(int *)(&DAT_0027bb3c + (ulong)type * 4);
  }
  throwInternalCompilerError("getInterpolationDescription",0x54);
}

Assistant:

const char* getInterpolationDescription (InterpolationType type)
{
    switch (type)
    {
        case InterpolationType::none:    return "none";
        case InterpolationType::latch:   return "latch";
        case InterpolationType::linear:  return "linear";
        case InterpolationType::sinc:    return "sinc";
        case InterpolationType::fast:    return "fast";
        case InterpolationType::best:    return "best";
    }

    SOUL_ASSERT_FALSE;
    return "";
}